

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O0

MPP_RET mpp_enc_ref_cfg_add_lt_cfg(MppEncRefCfg ref,RK_S32 cnt,MppEncRefLtFrmCfg *frm)

{
  MPP_RET MVar1;
  MppEncRefCfgImpl *p;
  MppEncRefLtFrmCfg *frm_local;
  RK_S32 cnt_local;
  MppEncRefCfg ref_local;
  
  MVar1 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_add_lt_cfg",ref);
  if (MVar1 == MPP_OK) {
    if (*(int *)((long)ref + 0xc) != 0) {
      _mpp_log_l(4,"mpp_enc_ref","ref %p add lt %d cfg idx %d tid %d gap %d delay %d ref mode %x\n",
                 (char *)0x0,ref,(ulong)*(uint *)((long)ref + 0x1c),frm->lt_idx,frm->temporal_id,
                 frm->lt_gap,frm->lt_delay,frm->ref_mode);
    }
    memcpy((void *)(*(long *)((long)ref + 0x28) + (long)*(int *)((long)ref + 0x1c) * 0x18),frm,
           (long)cnt * 0x18);
    *(RK_S32 *)((long)ref + 0x1c) = cnt + *(int *)((long)ref + 0x1c);
    ref_local._4_4_ = MPP_OK;
  }
  else {
    ref_local._4_4_ = MPP_ERR_VALUE;
  }
  return ref_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_add_lt_cfg(MppEncRefCfg ref, RK_S32 cnt, MppEncRefLtFrmCfg *frm)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_VALUE;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;

    if (p->debug)
        mpp_log("ref %p add lt %d cfg idx %d tid %d gap %d delay %d ref mode %x\n",
                ref, p->lt_cfg_cnt, frm->lt_idx, frm->temporal_id,
                frm->lt_gap, frm->lt_delay, frm->ref_mode);

    memcpy(&p->lt_cfg[p->lt_cfg_cnt], frm, sizeof(*frm) * cnt);
    p->lt_cfg_cnt += cnt;

    return MPP_OK;
}